

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest::InflateAndCheck
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ZLIBBufferCompressorTest *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input_buffer,ByteBuffer *compressed
          )

{
  allocator<unsigned_char> *this_00;
  bool bVar1;
  long lVar2;
  uchar *__first;
  char *message;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  uchar *result_array;
  size_t num_bytes;
  ByteBuffer local_d0 [8];
  ByteBuffer decompressed;
  ZLIBBufferInflator local_a0 [8];
  ZLIBBufferInflator decompressor;
  ByteBuffer *compressed_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *input_buffer_local;
  ZLIBBufferCompressorTest *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result_vector;
  
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_a0);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_d0);
  lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  __first = (uchar *)bidfx_public_api::tools::ByteBuffer::ToArray();
  gtest_ar.message_.ptr_._7_1_ = 0;
  this_00 = (allocator<unsigned_char> *)((long)&gtest_ar.message_.ptr_ + 6);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             __first + lVar2,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&gtest_ar.message_.ptr_ + 6));
  if (__first != (uchar *)0x0) {
    operator_delete(__first,1);
  }
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_108,"input_buffer","result_vector",input_buffer,
             __return_storage_ptr__);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  gtest_ar.message_.ptr_._7_1_ = 1;
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_d0);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> ZLIBBufferCompressorTest::InflateAndCheck(std::vector<unsigned char>& input_buffer,
                                                                     bidfx_public_api::tools::ByteBuffer& compressed)
{
    ZLIBBufferInflator decompressor;
    ByteBuffer decompressed = decompressor.Inflate(compressed);
    size_t num_bytes = decompressed.ReadableBytes();
    unsigned char* result_array = decompressed.ToArray();
    std::vector<unsigned char> result_vector = std::vector<unsigned char>(result_array, result_array + num_bytes);
    delete result_array;
    EXPECT_EQ(input_buffer, result_vector);
    return result_vector;
}